

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_duplex.cpp
# Opt level: O0

void device_collection_changed_callback(cubeb *context,void *user)

{
  bool bVar1;
  String *this;
  char *message;
  AssertionResult gtest_ar_;
  undefined1 in_stack_ffffffffffffffaf;
  AssertionResult *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Message *in_stack_ffffffffffffffc0;
  AssertHelper local_30 [2];
  AssertionResult local_20 [2];
  
  fprintf(_stderr,"collection changed callback\n");
  testing::AssertionResult::AssertionResult
            (in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_20);
  if (!bVar1) {
    testing::Message::Message(in_stack_ffffffffffffffc0);
    this = (String *)
           testing::Message::operator<<
                     (in_stack_ffffffffffffffc0,
                      (char (*) [71])CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&stack0xffffffffffffffc0,local_20,"false","false","true");
    message = testing::internal::String::c_str((String *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::AssertHelper
              (local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_duplex.cpp"
               ,0x88,message);
    testing::internal::AssertHelper::operator=(local_30,(Message *)this);
    testing::internal::AssertHelper::~AssertHelper(local_30);
    testing::internal::String::~String(this);
    testing::Message::~Message((Message *)0x108fcc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x108fe8);
  return;
}

Assistant:

void device_collection_changed_callback(cubeb * context, void * user)
{
  fprintf(stderr, "collection changed callback\n");
  ASSERT_TRUE(false) << "Error: device collection changed callback"
                        " called when opening a stream";
}